

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  secp256k1_fe_verify(r);
  uVar3 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar4 = (uVar3 >> 0x34) + r->n[1];
  uVar1 = (uVar4 >> 0x34) + r->n[2];
  uVar5 = uVar1 & 0xfffffffffffff;
  uVar1 = (uVar1 >> 0x34) + r->n[3];
  uVar2 = (uVar1 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar3 = uVar3 & 0xfffffffffffff;
  uVar6 = (ulong)(0xffffefffffc2e < uVar3 &&
                 ((uVar5 & uVar4 & uVar1) == 0xfffffffffffff && uVar2 == 0xffffffffffff)) |
          uVar2 >> 0x30;
  uVar3 = uVar6 * 0x1000003d1 + uVar3;
  uVar4 = (uVar3 >> 0x34) + (uVar4 & 0xfffffffffffff);
  uVar5 = (uVar4 >> 0x34) + uVar5;
  uVar1 = (uVar5 >> 0x34) + (uVar1 & 0xfffffffffffff);
  uVar2 = (uVar1 >> 0x34) + uVar2;
  if ((uint)(ushort)(uVar2 >> 0x30) == (uint)uVar6) {
    r->n[0] = uVar3 & 0xfffffffffffff;
    r->n[1] = uVar4 & 0xfffffffffffff;
    r->n[2] = uVar5 & 0xfffffffffffff;
    r->n[3] = uVar1 & 0xfffffffffffff;
    r->n[4] = uVar2 & 0xffffffffffff;
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
          ,0x48,"test condition failed: t4 >> 48 == x");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_normalize(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_normalize(r);
    r->magnitude = 1;
    r->normalized = 1;

    SECP256K1_FE_VERIFY(r);
}